

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

ImVector<unsigned_short> * __thiscall
ImVector<unsigned_short>::operator=(ImVector<unsigned_short> *this,ImVector<unsigned_short> *src)

{
  ImVector<unsigned_short> *in_RSI;
  ImVector<unsigned_short> *in_RDI;
  
  clear(in_RSI);
  resize(in_RSI,(int)((ulong)in_RDI >> 0x20));
  if (in_RSI->Data != (unsigned_short *)0x0) {
    memcpy(in_RDI->Data,in_RSI->Data,(long)in_RDI->Size << 1);
  }
  return in_RDI;
}

Assistant:

inline ImVector<T>& operator=(const ImVector<T>& src)   { clear(); resize(src.Size); if (src.Data) memcpy(Data, src.Data, (size_t)Size * sizeof(T)); return *this; }